

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  ulong uVar5;
  undefined1 (*pauVar6) [32];
  uint uVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  
  uVar2 = a->c;
  uVar7 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar9 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        pauVar6 = (undefined1 (*) [32])(a->cstep * uVar5 * a->elemsize + (long)a->data);
        pauVar8 = (undefined1 (*) [32])(c->cstep * uVar5 * c->elemsize + (long)c->data);
        fVar1 = *b->data;
        auVar13._4_4_ = fVar1;
        auVar13._0_4_ = fVar1;
        auVar13._8_4_ = fVar1;
        auVar13._12_4_ = fVar1;
        auVar14._16_4_ = fVar1;
        auVar14._0_16_ = auVar13;
        auVar14._20_4_ = fVar1;
        auVar14._24_4_ = fVar1;
        auVar14._28_4_ = fVar1;
        if ((int)uVar7 < 8) {
          uVar10 = 0;
        }
        else {
          iVar9 = 7;
          do {
            auVar4 = vsubps_avx(*pauVar6,auVar14);
            *pauVar8 = auVar4;
            pauVar6 = pauVar6 + 1;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 8;
            uVar10 = uVar7 & 0xfffffff8;
          } while (iVar9 < (int)uVar7);
        }
        if ((int)(uVar10 | 3) < (int)uVar7) {
          auVar13 = vshufps_avx(auVar13,auVar13,0);
          uVar11 = uVar10;
          do {
            auVar3 = vsubps_avx(*(undefined1 (*) [16])*pauVar6,auVar13);
            *(undefined1 (*) [16])*pauVar8 = auVar3;
            pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
            uVar10 = uVar11 + 4;
            iVar9 = uVar11 + 7;
            uVar11 = uVar10;
          } while (iVar9 < (int)uVar7);
        }
        if (uVar7 - uVar10 != 0 && (int)uVar10 <= (int)uVar7) {
          lVar12 = 0;
          do {
            *(float *)(*pauVar8 + lVar12 * 4) = *(float *)(*pauVar6 + lVar12 * 4) - fVar1;
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar10 != (int)lVar12);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar2);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}